

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_GTK.cxx
# Opt level: O0

int __thiscall Fl_GTK_File_Chooser::show(Fl_GTK_File_Chooser *this)

{
  int iVar1;
  char *pcVar2;
  char *pcStack_20;
  int retval;
  char *before;
  char *p;
  Fl_GTK_File_Chooser *this_local;
  
  pcStack_20 = (char *)0x0;
  fl_open_display();
  pcVar2 = setlocale(6,(char *)0x0);
  if (pcVar2 != (char *)0x0) {
    pcStack_20 = strdup(pcVar2);
  }
  if (show::gtk_wants != (char *)0x0) {
    setlocale(6,show::gtk_wants);
  }
  iVar1 = fl_gtk_chooser_wrapper(this);
  if ((show::first & 1U) != 0) {
    show::first = false;
    pcVar2 = setlocale(6,(char *)0x0);
    if (pcVar2 != (char *)0x0) {
      show::gtk_wants = strdup(pcVar2);
    }
  }
  if (pcStack_20 != (char *)0x0) {
    setlocale(6,pcStack_20);
    free(pcStack_20);
  }
  return iVar1;
}

Assistant:

int Fl_GTK_File_Chooser::show()
{
  // The point here is that after running a GTK dialog, the calling program's current locale is modified.
  // To avoid that, we memorize the calling program's current locale, and the locale as modified
  // by GTK after the first dialog use. We restore the calling program's current locale 
  // before returning, and we set the locale as modified by GTK before subsequent GTK dialog uses.
  static bool first = true;
  char *p;
  char *before = NULL;
  static char *gtk_wants = NULL;
  fl_open_display();
  // record in before the calling program's current locale
  p = setlocale(LC_ALL, NULL);
  if (p) before = strdup(p);
  if (gtk_wants) { // set the locale as GTK 'wants it'
    setlocale(LC_ALL, gtk_wants);
  }
  int retval = fl_gtk_chooser_wrapper(); // may change the locale
  if (first) {
    first = false;
    // record in gtk_wants the locale as modified by the GTK dialog
    p = setlocale(LC_ALL, NULL);
    if (p) gtk_wants = strdup(p);
  }
  if (before) {
    setlocale(LC_ALL, before); // restore calling program's current locale
    free(before);
    }
  return retval;
}